

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O1

int * Abc_NamStrHashFind(Abc_Nam_t *p,char *pStr,char *pLim)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  uint *puVar7;
  char *pcVar8;
  char *pcVar9;
  
  piVar4 = p->pBins;
  iVar5 = Abc_NamStrHash(pStr,pLim,p->nBins);
  if (*pStr == '\0') {
    __assert_fail("*pStr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilNam.c"
                  ,0x14b,"int *Abc_NamStrHashFind(Abc_Nam_t *, const char *, const char *)");
  }
  puVar7 = (uint *)(piVar4 + iVar5);
  uVar3 = *puVar7;
  if ((ulong)uVar3 == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    if (((int)uVar3 < 0) || ((p->vInt2Handle).nSize <= (int)uVar3)) {
LAB_001cda63:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pcVar8 = p->pStore + (p->vInt2Handle).pArray[uVar3];
  }
LAB_001cda33:
  if (pcVar8 == (char *)0x0) {
    return (int *)puVar7;
  }
  pcVar9 = pStr;
  if (pLim == (char *)0x0) {
    do {
      cVar1 = *pcVar9;
      if (cVar1 == '\0') goto LAB_001cd9f6;
      pcVar9 = pcVar9 + 1;
      cVar2 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 == cVar2);
  }
  else {
    do {
      if (pLim <= pcVar9) goto LAB_001cd9f6;
      cVar1 = *pcVar9;
      pcVar9 = pcVar9 + 1;
      cVar2 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 == cVar2);
  }
  goto LAB_001cd9fb;
LAB_001cd9f6:
  if (*pcVar8 == '\0') {
    return (int *)puVar7;
  }
LAB_001cd9fb:
  lVar6 = (long)(int)*puVar7;
  if ((lVar6 < 0) || ((p->vInt2Next).nSize <= (int)*puVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar4 = (p->vInt2Next).pArray;
  uVar3 = piVar4[lVar6];
  if ((ulong)uVar3 == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    if (((int)uVar3 < 0) || ((p->vInt2Handle).nSize <= (int)uVar3)) goto LAB_001cda63;
    pcVar8 = p->pStore + (p->vInt2Handle).pArray[uVar3];
  }
  puVar7 = (uint *)(piVar4 + lVar6);
  goto LAB_001cda33;
}

Assistant:

static inline int * Abc_NamStrHashFind( Abc_Nam_t * p, const char * pStr, const char * pLim )
{
    char * pThis;
    int * pPlace = (int *)(p->pBins + Abc_NamStrHash( pStr, pLim, p->nBins ));
    assert( *pStr );
    for ( pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL; 
          pThis;    pPlace = Abc_NamIntToNextP(p, *pPlace), 
          pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL )
              if ( !Abc_NamStrcmp( (char *)pStr, (char *)pLim, pThis ) )
                  break;
    return pPlace;
}